

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPolComponent_VectorImplementation.cpp
# Opt level: O1

void __thiscall
JPolComponent_VectorImplementation::ClearIndividualPolicies
          (JPolComponent_VectorImplementation *this)

{
  pointer ppPVar1;
  pointer ppPVar2;
  
  ppPVar1 = (this->_m_indivPols_PolicyPureVector).
            super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppPVar2 = (this->_m_indivPols_PolicyPureVector).
                 super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppPVar2 != ppPVar1; ppPVar2 = ppPVar2 + 1) {
    if (*ppPVar2 != (PolicyPureVector *)0x0) {
      (**(code **)(*(long *)*ppPVar2 + 8))();
    }
  }
  ppPVar2 = (this->_m_indivPols_PolicyPureVector).
            super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_m_indivPols_PolicyPureVector).
      super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppPVar2) {
    (this->_m_indivPols_PolicyPureVector).
    super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppPVar2;
  }
  return;
}

Assistant:

void JPolComponent_VectorImplementation::ClearIndividualPolicies()
{
    //NOTE: this means that when adding a ind. policy p to the joint policy (or 
    //replacing one) we should make a copy of p and insert the ref to this copy.
    //Otherwise deleting the joint policy deletes the individual policies, 
    //whose other references become dangling.
    vector<PolicyPureVector*>::iterator it = 
        _m_indivPols_PolicyPureVector.begin();
    vector<PolicyPureVector*>::iterator last = 
        _m_indivPols_PolicyPureVector.end();

    while(it != last)
    {
        delete (*it);
        it++;
    }
    _m_indivPols_PolicyPureVector.clear();    

}